

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O3

void __thiscall
cmIncludeDirectoryCommand::GetIncludes
          (cmIncludeDirectoryCommand *this,string *arg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *incs)

{
  long lVar1;
  string inc;
  string local_50;
  
  while( true ) {
    do {
      lVar1 = std::__cxx11::string::find((char)arg,10);
    } while (lVar1 == 0);
    if (lVar1 == -1) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)arg);
    NormalizeInclude(this,&local_50);
    if (local_50._M_string_length != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(incs,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)arg);
  NormalizeInclude(this,&local_50);
  if (local_50._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(incs,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmIncludeDirectoryCommand::GetIncludes(const std::string &arg,
                                            std::vector<std::string> &incs)
{
  // break apart any line feed arguments
  std::string::size_type pos = 0;
  std::string::size_type lastPos = 0;
  while((pos = arg.find('\n', lastPos)) != std::string::npos)
    {
    if (pos)
      {
      std::string inc = arg.substr(lastPos,pos);
      this->NormalizeInclude(inc);
      if (!inc.empty())
        {
        incs.push_back(inc);
        }
      }
    lastPos = pos + 1;
    }
  std::string inc = arg.substr(lastPos);
  this->NormalizeInclude(inc);
  if (!inc.empty())
    {
    incs.push_back(inc);
    }
}